

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O3

bool HACD::IntersectLineLine
               (Vec3<double> *p1,Vec3<double> *p2,Vec3<double> *p3,Vec3<double> *p4,Vec3<double> *pa
               ,Vec3<double> *pb,double *mua,double *mub)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  dVar7 = p4->m_data[0] - p3->m_data[0];
  dVar8 = p4->m_data[1] - p3->m_data[1];
  dVar9 = p4->m_data[2] - p3->m_data[2];
  if ((((dVar7 != 0.0) || (NAN(dVar7))) || (dVar8 != 0.0)) ||
     (((NAN(dVar8) || (dVar9 != 0.0)) || (NAN(dVar9))))) {
    dVar10 = p2->m_data[0] - p1->m_data[0];
    dVar11 = p2->m_data[1] - p1->m_data[1];
    dVar12 = p2->m_data[2] - p1->m_data[2];
    if (((dVar10 != 0.0) || (NAN(dVar10))) ||
       ((dVar11 != 0.0 || (((NAN(dVar11) || (dVar12 != 0.0)) || (NAN(dVar12))))))) {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar7;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar10;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar11 * dVar8;
      auVar36 = vfmadd231sd_fma(auVar36,auVar18,auVar34);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar8 * dVar8;
      auVar37 = vfmadd231sd_fma(auVar37,auVar18,auVar18);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar11 * dVar11;
      auVar40 = vfmadd231sd_fma(auVar40,auVar34,auVar34);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar9;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar12;
      auVar36 = vfmadd231sd_fma(auVar36,auVar14,auVar29);
      auVar37 = vfmadd231sd_fma(auVar37,auVar14,auVar14);
      auVar40 = vfmadd231sd_fma(auVar40,auVar29,auVar29);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = auVar36._0_8_ * auVar36._0_8_;
      auVar40 = vfmsub231sd_fma(auVar39,auVar37,auVar40);
      dVar38 = auVar40._0_8_;
      if ((dVar38 != 0.0) || (NAN(dVar38))) {
        dVar13 = p1->m_data[1] - p3->m_data[1];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = p1->m_data[0] - p3->m_data[0];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar11 * dVar13;
        auVar40 = vfmadd231sd_fma(auVar32,auVar21,auVar34);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar13 * dVar8;
        auVar18 = vfmadd231sd_fma(auVar28,auVar18,auVar21);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = p1->m_data[2] - p3->m_data[2];
        auVar40 = vfmadd231sd_fma(auVar40,auVar31,auVar29);
        auVar14 = vfmadd231sd_fma(auVar18,auVar14,auVar31);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auVar37._0_8_ * auVar40._0_8_;
        auVar40 = vfmsub231sd_fma(auVar22,auVar14,auVar36);
        auVar23._0_8_ = auVar40._0_8_ / dVar38;
        auVar23._8_8_ = auVar40._8_8_;
        auVar36 = vfmadd231sd_fma(auVar14,auVar36,auVar23);
        *mua = auVar23._0_8_;
        *mub = auVar36._0_8_ / auVar37._0_8_;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *mua;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = p1->m_data[0];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar10;
        auVar36 = vfmadd213sd_fma(auVar24,auVar35,auVar1);
        pa->m_data[0] = auVar36._0_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *mua;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = p1->m_data[1];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar11;
        auVar36 = vfmadd213sd_fma(auVar25,auVar33,auVar2);
        pa->m_data[1] = auVar36._0_8_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *mua;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = p1->m_data[2];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar12;
        auVar36 = vfmadd213sd_fma(auVar26,auVar30,auVar3);
        pa->m_data[2] = auVar36._0_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *mub;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = p3->m_data[0];
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar7;
        auVar36 = vfmadd213sd_fma(auVar27,auVar19,auVar4);
        pb->m_data[0] = auVar36._0_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *mub;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = p3->m_data[1];
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar8;
        auVar36 = vfmadd213sd_fma(auVar20,auVar16,auVar5);
        pb->m_data[1] = auVar36._0_8_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *mub;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = p3->m_data[2];
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar9;
        auVar36 = vfmadd213sd_fma(auVar17,auVar15,auVar6);
        pb->m_data[2] = auVar36._0_8_;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IntersectLineLine(const Vec3<double> & p1, const Vec3<double> & p2, 
                          const Vec3<double> & p3, const Vec3<double> & p4,
                          Vec3<double> & pa, Vec3<double> & pb, 
                          double & mua, double & mub)
    {
        Vec3<double> p13,p43,p21;
        double d1343,d4321,d1321,d4343,d2121;
        double numer,denom;
        
        p13.X() = p1.X() - p3.X();
        p13.Y() = p1.Y() - p3.Y();
        p13.Z() = p1.Z() - p3.Z();
        p43.X() = p4.X() - p3.X();
        p43.Y() = p4.Y() - p3.Y();
        p43.Z() = p4.Z() - p3.Z();
        if (p43.X()==0.0 && p43.Y()==0.0 && p43.Z()==0.0)
            return false;
        p21.X() = p2.X() - p1.X();
        p21.Y() = p2.Y() - p1.Y();
        p21.Z() = p2.Z() - p1.Z();
        if (p21.X()==0.0 && p21.Y()==0.0 && p21.Z()==0.0)
            return false;
        
        d1343 = p13.X() * p43.X() + p13.Y() * p43.Y() + p13.Z() * p43.Z();
        d4321 = p43.X() * p21.X() + p43.Y() * p21.Y() + p43.Z() * p21.Z();
        d1321 = p13.X() * p21.X() + p13.Y() * p21.Y() + p13.Z() * p21.Z();
        d4343 = p43.X() * p43.X() + p43.Y() * p43.Y() + p43.Z() * p43.Z();
        d2121 = p21.X() * p21.X() + p21.Y() * p21.Y() + p21.Z() * p21.Z();
        
        denom = d2121 * d4343 - d4321 * d4321;
        if (denom==0.0)
            return false;
        numer = d1343 * d4321 - d1321 * d4343;
        
        mua = numer / denom;
        mub = (d1343 + d4321 * (mua)) / d4343;
        
        pa.X() = p1.X() + mua * p21.X();
        pa.Y() = p1.Y() + mua * p21.Y();
        pa.Z() = p1.Z() + mua * p21.Z();
        pb.X() = p3.X() + mub * p43.X();
        pb.Y() = p3.Y() + mub * p43.Y();
        pb.Z() = p3.Z() + mub * p43.Z();
        
        return true;
    }